

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O1

HTS_Boolean HTS_dp_match(char *string,char *pattern,size_t pos,size_t max)

{
  char cVar1;
  HTS_Boolean HVar2;
  
  while( true ) {
    if (max < pos) {
      return '\0';
    }
    if ((*string == '\0') && (*pattern == '\0')) {
      return '\x01';
    }
    cVar1 = *pattern;
    if (cVar1 != '*') break;
    HVar2 = HTS_dp_match(string + 1,pattern,pos + 1,max);
    if (HVar2 != '\0') {
      return '\x01';
    }
    pattern = pattern + 1;
  }
  if (*string != cVar1 && cVar1 != '?') {
    return '\0';
  }
  HVar2 = HTS_dp_match(string + 1,pattern + 1,pos + 1,max + 1);
  if (HVar2 == '\0') {
    return '\0';
  }
  return '\x01';
}

Assistant:

static HTS_Boolean HTS_dp_match(const char *string, const char *pattern, size_t pos, size_t max)
{
   if (pos > max)
      return FALSE;
   if (string[0] == '\0' && pattern[0] == '\0')
      return TRUE;
   if (pattern[0] == '*') {
      if (HTS_dp_match(string + 1, pattern, pos + 1, max) == 1)
         return TRUE;
      else
         return HTS_dp_match(string, pattern + 1, pos, max);
   }
   if (string[0] == pattern[0] || pattern[0] == '?') {
      if (HTS_dp_match(string + 1, pattern + 1, pos + 1, max + 1) == 1)
         return TRUE;
   }

   return FALSE;
}